

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractlistview.cpp
# Opt level: O2

void QtMWidgets::AbstractListViewBase::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      rowTouched((AbstractListViewBase *)_o,*_a[1]);
      return;
    case 1:
      rowLongTouched((AbstractListViewBase *)_o,*_a[1]);
      return;
    case 2:
      rowDoubleTouched((AbstractListViewBase *)_o,*_a[1]);
      return;
    case 3:
      (**(code **)(*(long *)_o + 0x1c0))(_o,*_a[1],*_a[2]);
      return;
    case 4:
      (**(code **)(*(long *)_o + 0x1c8))();
      return;
    case 5:
      (**(code **)(*(long *)_o + 0x1d0))(_o,*_a[1],*_a[2]);
      return;
    case 6:
      (**(code **)(*(long *)_o + 0x1d8))(_o,*_a[1],*_a[2]);
      return;
    case 7:
      (**(code **)(*(long *)_o + 0x1e0))(_o,*_a[1],*_a[2],*_a[3]);
      return;
    case 8:
      (**(code **)(*(long *)_o + 0x1e8))();
      return;
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      piVar4 = (int *)*_a;
      iVar5 = spacing((AbstractListViewBase *)_o);
      *piVar4 = iVar5;
      return;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      setSpacing((AbstractListViewBase *)_o,**_a);
      return;
    }
    break;
  case IndexOfMethod:
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == rowTouched && lVar3 == 0) {
      *puVar1 = 0;
      return;
    }
    if (pcVar2 == rowLongTouched && lVar3 == 0) {
      *puVar1 = 1;
      return;
    }
    if (pcVar2 == rowDoubleTouched && lVar3 == 0) {
      *puVar1 = 2;
      return;
    }
  }
  return;
}

Assistant:

void QtMWidgets::AbstractListViewBase::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AbstractListViewBase *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->rowTouched((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->rowLongTouched((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->rowDoubleTouched((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->modelReset(); break;
        case 5: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 7: _t->rowsMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 8: _t->timerElapsed(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (AbstractListViewBase::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListViewBase::rowTouched)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (AbstractListViewBase::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListViewBase::rowLongTouched)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (AbstractListViewBase::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListViewBase::rowDoubleTouched)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<AbstractListViewBase *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->spacing(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<AbstractListViewBase *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSpacing(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}